

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

void __thiscall
wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>::
noteExpressionOrCopy
          (StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner> *this,
          Expression *expr,HeapType type,Index index,LUBFinder *info)

{
  PassRunner *pPVar1;
  Module *module;
  uintptr_t uVar2;
  pointer pFVar3;
  Index IVar4;
  Expression *pEVar5;
  bool bVar6;
  Expression *pEVar7;
  Expression **ppEVar8;
  HeapType HVar9;
  Struct *pSVar10;
  Type b;
  Type TVar11;
  Type local_60;
  Type noted;
  HeapType local_40;
  Index local_34;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           ).super_Pass.runner;
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           ).
           super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
           .
           super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
           .currModule;
  pEVar5 = expr;
  noted.id = type.id;
  local_34 = index;
  do {
    pEVar7 = pEVar5;
    local_40.id = (uintptr_t)pEVar7;
    ppEVar8 = Properties::getImmediateFallthroughPtr
                        ((Expression **)&local_40,&pPVar1->options,module,NoTeeBrIf);
    IVar4 = local_34;
    TVar11 = noted;
    pEVar5 = *ppEVar8;
  } while (*ppEVar8 != pEVar7);
  if ((pEVar7->type).id == (expr->type).id) {
    expr = pEVar7;
  }
  if ((((expr->_id == StructGetId) && (*(uint *)(expr + 1) == local_34)) &&
      (uVar2 = expr[1].type.id, *(long *)(uVar2 + 8) != 1)) &&
     (HVar9 = wasm::Type::getHeapType((Type *)(uVar2 + 8)), HVar9.id == TVar11.id)) {
    return;
  }
  b.id = (expr->type).id;
  local_40.id = TVar11.id;
  local_60.id = b.id;
  pSVar10 = HeapType::getStruct(&local_40);
  pFVar3 = (pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar11.id = pFVar3[IVar4].type.id;
  if (((TVar11.id & 1) == 0 && 6 < TVar11.id) &&
     (bVar6 = wasm::Type::isExact(&pFVar3[IVar4].type), !bVar6)) {
    b = wasm::Type::withInexactIfNoCustomDescs
                  (&local_60,
                   (FeatureSet)
                   (((this->
                     super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                     ).
                     super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                     .
                     super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                    .currModule)->features).features);
    local_60 = b;
  }
  TVar11 = wasm::Type::getLeastUpperBound((info->lub).id,b);
  (info->lub).id = TVar11.id;
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }